

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# squeeze.c
# Opt level: O0

void ZopfliLZ77OptimalFixed
               (ZopfliBlockState *s,uchar *in,size_t instart,size_t inend,ZopfliLZ77Store *store)

{
  void *__ptr;
  void *path_00;
  long in_RCX;
  long in_RDX;
  long in_RDI;
  float *costs;
  ZopfliHash *h;
  ZopfliHash hash;
  size_t pathsize;
  unsigned_short *path;
  unsigned_short *length_array;
  size_t blocksize;
  ZopfliHash *in_stack_ffffffffffffff08;
  size_t in_stack_ffffffffffffff10;
  size_t in_stack_ffffffffffffff38;
  uchar *pathsize_00;
  ZopfliBlockState *in_stack_ffffffffffffff50;
  unsigned_short *in_stack_ffffffffffffff60;
  CostModelFun *in_stack_ffffffffffffff68;
  void *in_stack_ffffffffffffff70;
  ZopfliLZ77Store *in_stack_ffffffffffffff78;
  ZopfliHash *in_stack_ffffffffffffff80;
  float *in_stack_ffffffffffffff88;
  
  __ptr = malloc(((in_RCX - in_RDX) + 1) * 2);
  pathsize_00 = &stack0xffffffffffffff50;
  path_00 = malloc(((in_RCX - in_RDX) + 1) * 4);
  if (path_00 == (void *)0x0) {
    exit(-1);
  }
  if (__ptr == (void *)0x0) {
    exit(-1);
  }
  ZopfliAllocHash(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  *(long *)(in_RDI + 0x10) = in_RDX;
  *(long *)(in_RDI + 0x18) = in_RCX;
  LZ77OptimalRun(in_stack_ffffffffffffff50,pathsize_00,(size_t)path_00,in_stack_ffffffffffffff38,
                 (unsigned_short **)path_00,(size_t *)pathsize_00,in_stack_ffffffffffffff60,
                 in_stack_ffffffffffffff68,in_stack_ffffffffffffff70,in_stack_ffffffffffffff78,
                 in_stack_ffffffffffffff80,in_stack_ffffffffffffff88);
  free(__ptr);
  free((void *)0x0);
  free(path_00);
  ZopfliCleanHash((ZopfliHash *)0x10aa1a);
  return;
}

Assistant:

void ZopfliLZ77OptimalFixed(ZopfliBlockState *s,
                            const unsigned char* in,
                            size_t instart, size_t inend,
                            ZopfliLZ77Store* store)
{
  /* Dist to get to here with smallest cost. */
  size_t blocksize = inend - instart;
  unsigned short* length_array =
      (unsigned short*)malloc(sizeof(unsigned short) * (blocksize + 1));
  unsigned short* path = 0;
  size_t pathsize = 0;
  ZopfliHash hash;
  ZopfliHash* h = &hash;
  float* costs = (float*)malloc(sizeof(float) * (blocksize + 1));

  if (!costs) exit(-1); /* Allocation failed. */
  if (!length_array) exit(-1); /* Allocation failed. */

  ZopfliAllocHash(ZOPFLI_WINDOW_SIZE, h);

  s->blockstart = instart;
  s->blockend = inend;

  /* Shortest path for fixed tree This one should give the shortest possible
  result for fixed tree, no repeated runs are needed since the tree is known. */
  LZ77OptimalRun(s, in, instart, inend, &path, &pathsize,
                 length_array, GetCostFixed, 0, store, h, costs);

  free(length_array);
  free(path);
  free(costs);
  ZopfliCleanHash(h);
}